

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnReturn(TypeChecker *this)

{
  Result RVar1;
  Enum EVar2;
  Result RVar3;
  Label *in_RAX;
  Label *func_label;
  Label *local_18;
  
  local_18 = in_RAX;
  RVar1 = GetLabel(this,(int)((ulong)((long)(this->label_stack_).
                                            super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->label_stack_).
                                           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        0x38e38e39 - 1,&local_18);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = PopAndCheckSignature(this,&local_18->result_types,"return");
    RVar3 = SetUnreachable(this);
    EVar2 = (Enum)(RVar3.enum_ == Error || RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::OnReturn() {
  Result result = Result::Ok;
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= PopAndCheckSignature(func_label->result_types, "return");
  CHECK_RESULT(SetUnreachable());
  return result;
}